

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::DeleteProperty
               (RecyclableObject *instance,JavascriptString *propertyNameString,
               PropertyOperationFlags propertyOperationFlags)

{
  int iVar1;
  PropertyOperationFlags propertyOperationFlags_local;
  JavascriptString *propertyNameString_local;
  RecyclableObject *instance_local;
  
  iVar1 = (*(instance->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x22])
                    (instance,propertyNameString,(ulong)propertyOperationFlags);
  return iVar1;
}

Assistant:

BOOL JavascriptOperators::DeleteProperty(RecyclableObject* instance, JavascriptString *propertyNameString, PropertyOperationFlags propertyOperationFlags)
    {
#ifdef ENABLE_MUTATION_BREAKPOINT
        ScriptContext *scriptContext = instance->GetScriptContext();
        if (MutationBreakpoint::IsFeatureEnabled(scriptContext)
            && scriptContext->HasMutationBreakpoints())
        {
            MutationBreakpoint::HandleDeleteProperty(scriptContext, instance, propertyNameString);
        }
#endif
        return instance->DeleteProperty(propertyNameString, propertyOperationFlags);
    }